

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O3

string * __thiscall
csv::internals::format_row
          (string *__return_storage_ptr__,internals *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *row,string_view delim)

{
  string *psVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  stringstream ret;
  char local_1c1;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar2 = *(long *)this;
  if (*(long *)(this + 8) != lVar2) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,*(char **)(lVar2 + -8 + lVar3),*(long *)(lVar2 + lVar3));
      uVar4 = uVar4 + 1;
      if (uVar4 < (ulong)(*(long *)(this + 8) - *(long *)this >> 5)) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)delim._M_len,(long)row)
        ;
      }
      else {
        local_1c1 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1c1,1);
      }
      lVar2 = *(long *)this;
      lVar3 = lVar3 + 0x20;
    } while (uVar4 < (ulong)(*(long *)(this + 8) - lVar2 >> 5));
  }
  std::ostream::flush();
  psVar1 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

CSV_INLINE std::string format_row(const std::vector<std::string>& row, csv::string_view delim) {
            /** Print a CSV row */
            std::stringstream ret;
            for (size_t i = 0; i < row.size(); i++) {
                ret << row[i];
                if (i + 1 < row.size()) ret << delim;
                else ret << '\n';
            }
            ret.flush();

            return ret.str();
        }